

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocalserver_unix.cpp
# Opt level: O1

int __thiscall QLocalServerPrivate::listen(QLocalServerPrivate *this,int __fd,int __n)

{
  QObject *pQVar1;
  qsizetype qVar2;
  __mode_t __mode;
  Data *pDVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined1 *puVar6;
  char cVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  QSocketNotifier *this_00;
  int *piVar11;
  __mode_t _Var12;
  undefined4 in_register_00000034;
  QString *pQVar13;
  QStringBuilder<QString,_QLatin1String> *__args;
  char16_t *pcVar14;
  _Storage<QTemporaryDir,_false> *this_01;
  QArrayData *pQVar15;
  QArrayData *pQVar16;
  uint uVar17;
  char16_t *pcVar18;
  socklen_t __len;
  long in_FS_OFFSET;
  QByteArrayView QVar19;
  QByteArrayView QVar20;
  QByteArrayView QVar21;
  QByteArrayView QVar22;
  QLatin1StringView latin1;
  QFileInfo serverNameFileInfo;
  sockaddr_un addr;
  undefined1 *local_158;
  QObject local_140 [8];
  QArrayData *local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  QString local_118;
  undefined1 *local_100;
  QArrayData *local_f8;
  char16_t *pcStack_f0;
  undefined1 *local_e8;
  QString local_d8;
  _Storage<QTemporaryDir,_false> local_b8;
  ulong uStack_b0;
  QStringBuilder<QString,_QLatin1String> local_a8;
  undefined2 uStack_80;
  undefined6 uStack_7e;
  undefined2 local_78;
  undefined6 uStack_76;
  undefined2 uStack_70;
  undefined6 uStack_6e;
  undefined2 local_68;
  undefined6 uStack_66;
  undefined2 uStack_60;
  undefined6 uStack_5e;
  undefined2 local_58;
  undefined6 uStack_56;
  undefined2 uStack_50;
  undefined4 uStack_4e;
  undefined2 uStack_4a;
  undefined2 uStack_48;
  undefined4 uStack_46;
  undefined8 uStack_42;
  long local_38;
  
  pQVar13 = (QString *)CONCAT44(in_register_00000034,__fd);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QObject **)&this->field_0x8;
  if ((*(long **)&this->field_0x48 != (long *)0x0) && (**(long **)&this->field_0x48 != 0)) {
    QBindingStorage::registerDependency_helper((QUntypedPropertyData *)&this->field_0x40);
  }
  uVar9 = (this->socketOptions).super_QPropertyData<QFlags<QLocalServer::SocketOption>_>.val.
          super_QFlagsStorageHelper<QLocalServer::SocketOption,_4>.
          super_QFlagsStorage<QLocalServer::SocketOption>.i;
  uVar17 = 8;
  if ((uVar9 & 8) == 0) {
    uVar17 = uVar9;
  }
  if ((uVar17 & 8) == 0) {
    cVar7 = QString::startsWith((QChar)(char16_t)__fd,0x2f);
    if (cVar7 != '\0') goto LAB_00245bee;
    QDir::tempPath();
    QDir::cleanPath((QString *)&local_a8);
    pQVar15 = &((this->fullServerName).d.d)->super_QArrayData;
    pcVar18 = (this->fullServerName).d.ptr;
    pDVar3 = (Data *)CONCAT62(local_a8.a.d.d._2_6_,local_a8.a.d.d._0_2_);
    local_a8.a.d.d._0_2_ = SUB82(pQVar15,0);
    local_a8.a.d.d._2_6_ = (undefined6)((ulong)pQVar15 >> 0x10);
    (this->fullServerName).d.d = pDVar3;
    (this->fullServerName).d.ptr =
         (char16_t *)CONCAT62(local_a8.a.d.ptr._2_6_,local_a8.a.d.ptr._0_2_);
    local_a8.a.d.ptr._0_2_ = (char16_t)pcVar18;
    local_a8.a.d.ptr._2_6_ = (undefined6)((ulong)pcVar18 >> 0x10);
    qVar2 = (this->fullServerName).d.size;
    (this->fullServerName).d.size = CONCAT62(local_a8.a.d.size._2_6_,(undefined2)local_a8.a.d.size);
    local_a8.a.d.size._0_2_ = (undefined2)qVar2;
    local_a8.a.d.size._2_6_ = (undefined6)((ulong)qVar2 >> 0x10);
    if (pQVar15 != (QArrayData *)0x0) {
      LOCK();
      (pQVar15->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar15->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar15->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar15,2,0x10);
      }
    }
    if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,0x10);
      }
    }
    local_a8.a.d.d._0_2_ = 0x2f;
    local_a8.a.d.ptr._2_6_ = (undefined6)((ulong)pQVar13 >> 0x10);
    local_a8.a.d.ptr._0_2_ = (char16_t)__fd;
    operator+=(&this->fullServerName,(QStringBuilder<char16_t,_const_QString_&> *)&local_a8);
  }
  else {
LAB_00245bee:
    QString::operator=(&this->fullServerName,pQVar13);
  }
  QString::operator=(&this->serverName,pQVar13);
  local_e8 = &DAT_aaaaaaaaaaaaaaaa;
  local_f8 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  pcStack_f0 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::toLocal8Bit_helper((QChar *)&local_f8,(longlong)(this->fullServerName).d.ptr);
  local_b8 = (_Storage<QTemporaryDir,_false>)&DAT_aaaaaaaaaaaaaaaa;
  uStack_b0 = 0xaaaaaaaaaaaaaa00;
  if ((uVar17 & 7) == 0) {
    local_158 = (undefined1 *)0x0;
    pcVar18 = (char16_t *)0x0;
    pQVar15 = (QArrayData *)0x0;
LAB_00245fae:
    iVar8 = ::socket(1,0x80001,0);
    puVar6 = local_e8;
    this->listenSocket = iVar8;
    if (iVar8 == -1) {
      QVar21.m_data = (storage_type *)0x14;
      QVar21.m_size = (qsizetype)&local_a8;
      QString::fromLatin1(QVar21);
      pQVar16 = (QArrayData *)CONCAT62(local_a8.a.d.d._2_6_,local_a8.a.d.d._0_2_);
      local_d8.d.ptr = (char16_t *)CONCAT62(local_a8.a.d.ptr._2_6_,local_a8.a.d.ptr._0_2_);
      local_d8.d.size = CONCAT62(local_a8.a.d.size._2_6_,(undefined2)local_a8.a.d.size);
      local_d8.d.d = (Data *)pQVar16;
      setError(this,&local_d8);
      if (pQVar16 == (QArrayData *)0x0) goto LAB_0024610b;
      LOCK();
      (pQVar16->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar16->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      iVar8 = (pQVar16->ref_)._q_value.super___atomic_base<int>._M_i;
      UNLOCK();
      pQVar16 = &(local_d8.d.d)->super_QArrayData;
joined_r0x002460f2:
      if (iVar8 == 0) {
LAB_002460fc:
        QArrayData::deallocate(pQVar16,2,0x10);
      }
LAB_0024610b:
      closeServer(this);
      goto LAB_00246113;
    }
    local_a8.a.d.d._0_2_ = 1;
    local_a8.a.d.d._2_6_ = 0;
    local_a8.a.d.ptr._0_2_ = L'\0';
    local_a8.a.d.ptr._2_6_ = 0;
    local_a8.a.d.size._0_2_ = 0;
    local_a8.a.d.size._2_6_ = 0;
    local_a8.b.m_size._0_2_ = 0;
    local_a8.b.m_size._2_6_ = 0;
    local_a8.b.m_data._0_2_ = 0;
    local_a8.b.m_data._2_6_ = 0;
    uStack_80 = 0;
    uStack_7e = 0;
    local_78 = 0;
    uStack_76 = 0;
    uStack_70 = 0;
    uStack_6e = 0;
    local_68 = 0;
    uStack_66 = 0;
    uStack_60 = 0;
    uStack_5e = 0;
    local_58 = 0;
    uStack_56 = 0;
    uStack_50 = 0;
    uStack_4e = 0;
    uStack_4a = 0;
    uStack_48 = 0;
    uStack_46 = 0;
    uStack_42 = 0;
    if (local_e8 + -0x6b < (undefined1 *)0xffffffffffffff93) {
LAB_00246064:
      QVar20.m_data = (storage_type *)0x14;
      QVar20.m_size = (qsizetype)&local_d8;
      QString::fromLatin1(QVar20);
      pDVar3 = local_d8.d.d;
      local_118.d.d = local_d8.d.d;
      local_118.d.ptr = local_d8.d.ptr;
      local_118.d.size = local_d8.d.size;
      setError(this,&local_118);
      if (&pDVar3->super_QArrayData == (QArrayData *)0x0) goto LAB_0024610b;
      LOCK();
      (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      iVar8 = (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
      UNLOCK();
      pQVar16 = &(local_118.d.d)->super_QArrayData;
      goto joined_r0x002460f2;
    }
    if ((uVar17 & 8) == 0) {
      if ((uVar17 & 7) == 0) {
        pcVar14 = pcStack_f0;
        local_158 = local_e8;
        if (pcStack_f0 == (char16_t *)0x0) {
          pcVar14 = (char16_t *)&QByteArray::_empty;
        }
      }
      else {
        if (local_158 + -0x6c < (undefined1 *)0xffffffffffffff93) goto LAB_00246064;
        pcVar14 = pcVar18;
        if (pcVar18 == (char16_t *)0x0) {
          pcVar14 = (char16_t *)&QByteArray::_empty;
        }
      }
      __memcpy_chk((undefined1 *)((long)&local_a8.a.d.d + 2),pcVar14,local_158 + 1,0x6c);
      __len = 0x6e;
    }
    else {
      pcVar14 = pcStack_f0;
      if (pcStack_f0 == (char16_t *)0x0) {
        pcVar14 = (char16_t *)&QByteArray::_empty;
      }
      __memcpy_chk((undefined1 *)((long)&local_a8.a.d.d + 3),pcVar14,local_e8 + 1,0x6b);
      __len = (int)puVar6 + 3;
    }
    iVar8 = bind(iVar8,(sockaddr *)&local_a8,__len);
    if (iVar8 == -1) {
      QVar22.m_data = (storage_type *)0x14;
      QVar22.m_size = (qsizetype)&local_d8;
      QString::fromLatin1(QVar22);
      pDVar3 = local_d8.d.d;
      local_118.d.d = local_d8.d.d;
      local_118.d.ptr = local_d8.d.ptr;
      local_118.d.size = local_d8.d.size;
      setError(this,&local_118);
      if (&pDVar3->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_118.d.d)->super_QArrayData,2,0x10);
        }
      }
      piVar11 = __errno_location();
      if (*piVar11 == 0x62) {
        iVar8 = this->listenSocket;
        do {
          iVar10 = ::close(iVar8);
          if (iVar10 != -1) break;
        } while (*piVar11 == 4);
      }
      else {
        closeServer(this);
      }
      this->listenSocket = -1;
      goto LAB_00246113;
    }
    iVar8 = ::listen(this->listenSocket,this->listenBacklog);
    if (iVar8 == -1) goto LAB_00246064;
    if ((uVar17 & 7) != 0) {
      uVar9 = -(uVar17 & 1) & 0x1c0;
      _Var12 = uVar9 + 0x38;
      if ((uVar17 & 2) == 0) {
        _Var12 = uVar9;
      }
      __mode = _Var12 + 7;
      if ((uVar17 & 4) == 0) {
        __mode = _Var12;
      }
      if (pcVar18 == (char16_t *)0x0) {
        pcVar18 = (char16_t *)&QByteArray::_empty;
      }
      iVar8 = chmod((char *)pcVar18,__mode);
      if (iVar8 != -1) {
        pcVar14 = pcStack_f0;
        if (pcStack_f0 == (char16_t *)0x0) {
          pcVar14 = (char16_t *)&QByteArray::_empty;
        }
        iVar8 = rename((char *)pcVar18,(char *)pcVar14);
        if (iVar8 != -1) goto LAB_002462cb;
      }
      latin1.m_data = "QLocalServer::listen";
      latin1.m_size = 0x14;
      QString::QString(&local_d8,latin1);
      setError(this,&local_d8);
      if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        pQVar16 = &(local_d8.d.d)->super_QArrayData;
        if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i != 0)
        goto LAB_0024610b;
        goto LAB_002460fc;
      }
      goto LAB_0024610b;
    }
LAB_002462cb:
    this_00 = (QSocketNotifier *)operator_new(0x10);
    QSocketNotifier::QSocketNotifier(this_00,(long)this->listenSocket,Read,pQVar1);
    this->socketNotifier = this_00;
    QObject::connect(local_140,(char *)this_00,(QObject *)"2activated(QSocketDescriptor)",
                     (char *)pQVar1,0x282202);
    QMetaObject::Connection::~Connection((Connection *)local_140);
    QSocketNotifier::setEnabled(SUB81(this->socketNotifier,0));
    iVar8 = (int)CONCAT71((int7)((ulong)this >> 8),1);
  }
  else {
    local_100 = &DAT_aaaaaaaaaaaaaaaa;
    QFileInfo::QFileInfo((QFileInfo *)&local_100,(QString *)&this->fullServerName);
    QFileInfo::absolutePath();
    qVar2 = local_d8.d.size;
    pcVar18 = local_d8.d.ptr;
    pDVar3 = local_d8.d.d;
    local_d8.d.d = (Data *)0x0;
    local_d8.d.ptr = (char16_t *)0x0;
    __args = &local_a8;
    local_a8.a.d.d._0_2_ = SUB82(pDVar3,0);
    local_a8.a.d.d._2_6_ = (undefined6)((ulong)pDVar3 >> 0x10);
    local_a8.a.d.ptr._0_2_ = (char16_t)pcVar18;
    local_a8.a.d.ptr._2_6_ = (undefined6)((ulong)pcVar18 >> 0x10);
    local_d8.d.size = 0;
    local_a8.a.d.size._0_2_ = (undefined2)qVar2;
    local_a8.a.d.size._2_6_ = (undefined6)((ulong)qVar2 >> 0x10);
    local_a8.b.m_size._0_2_ = 0x2f;
    this_01 = &local_b8;
    std::optional<QTemporaryDir>::emplace<QStringBuilder<QString,char16_t>>
              ((optional<QTemporaryDir> *)&this_01->_M_value,
               (QStringBuilder<QString,_char16_t> *)__args);
    iVar8 = (int)this_01;
    iVar10 = (int)__args;
    piVar11 = (int *)CONCAT62(local_a8.a.d.d._2_6_,local_a8.a.d.d._0_2_);
    if (piVar11 != (int *)0x0) {
      LOCK();
      *piVar11 = *piVar11 + -1;
      UNLOCK();
      if (*piVar11 == 0) {
        pQVar15 = (QArrayData *)CONCAT62(local_a8.a.d.d._2_6_,local_a8.a.d.d._0_2_);
        iVar10 = 2;
        QArrayData::deallocate(pQVar15,2,0x10);
        iVar8 = (int)pQVar15;
      }
    }
    if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        iVar10 = 2;
        pQVar15 = &(local_d8.d.d)->super_QArrayData;
        QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,0x10);
        iVar8 = (int)pQVar15;
      }
    }
    if ((char)uStack_b0 == '\0') {
      listen(iVar8,iVar10);
LAB_0024641c:
      listen(iVar8,iVar10);
      goto LAB_00246421;
    }
    iVar8 = (int)&local_b8;
    cVar7 = QTemporaryDir::isValid();
    if (cVar7 == '\0') {
      QVar19.m_data = (storage_type *)0x14;
      QVar19.m_size = (qsizetype)&local_a8;
      QString::fromLatin1(QVar19);
      pQVar15 = (QArrayData *)CONCAT62(local_a8.a.d.d._2_6_,local_a8.a.d.d._0_2_);
      local_d8.d.ptr = (char16_t *)CONCAT62(local_a8.a.d.ptr._2_6_,local_a8.a.d.ptr._0_2_);
      local_d8.d.size = CONCAT62(local_a8.a.d.size._2_6_,(undefined2)local_a8.a.d.size);
      local_d8.d.d = (Data *)pQVar15;
      setError(this,&local_d8);
      if (pQVar15 != (QArrayData *)0x0) {
        LOCK();
        (pQVar15->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar15->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar15->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,0x10);
        }
      }
      local_158 = (undefined1 *)0x0;
      pcVar18 = (char16_t *)0x0;
      pQVar15 = (QArrayData *)0x0;
    }
    else {
      if ((char)uStack_b0 == '\0') goto LAB_0024641c;
      QTemporaryDir::path();
      uVar5 = local_128;
      uVar4 = uStack_130;
      pQVar15 = local_138;
      local_138 = (QArrayData *)0x0;
      uStack_130 = 0;
      local_a8.a.d.d._0_2_ = SUB82(pQVar15,0);
      local_a8.a.d.d._2_6_ = (undefined6)((ulong)pQVar15 >> 0x10);
      local_a8.a.d.ptr._0_2_ = (char16_t)uVar4;
      local_a8.a.d.ptr._2_6_ = (undefined6)((ulong)uVar4 >> 0x10);
      local_128 = 0;
      local_a8.a.d.size._0_2_ = (undefined2)uVar5;
      local_a8.a.d.size._2_6_ = (undefined6)((ulong)uVar5 >> 0x10);
      local_a8.b.m_size._0_2_ = 2;
      local_a8.b.m_size._2_6_ = 0;
      local_a8.b.m_data._0_2_ = 0x21e1;
      local_a8.b.m_data._2_6_ = 0x28;
      QStringBuilder<QString,_QLatin1String>::convertTo<QString>(&local_118,&local_a8);
      QString::toLocal8Bit_helper((QChar *)&local_d8,(longlong)local_118.d.ptr);
      pcVar18 = local_d8.d.ptr;
      pQVar15 = &(local_d8.d.d)->super_QArrayData;
      local_d8.d.d = (Data *)0x0;
      local_d8.d.ptr = (char16_t *)0x0;
      local_158 = (undefined1 *)local_d8.d.size;
      local_d8.d.size = 0;
      if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_118.d.d)->super_QArrayData,2,0x10);
        }
      }
      piVar11 = (int *)CONCAT62(local_a8.a.d.d._2_6_,local_a8.a.d.d._0_2_);
      if (piVar11 != (int *)0x0) {
        LOCK();
        *piVar11 = *piVar11 + -1;
        UNLOCK();
        if (*piVar11 == 0) {
          QArrayData::deallocate
                    ((QArrayData *)CONCAT62(local_a8.a.d.d._2_6_,local_a8.a.d.d._0_2_),2,0x10);
        }
      }
      if (local_138 != (QArrayData *)0x0) {
        LOCK();
        (local_138->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_138->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_138->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_138,2,0x10);
        }
      }
    }
    QFileInfo::~QFileInfo((QFileInfo *)&local_100);
    if (cVar7 != '\0') goto LAB_00245fae;
LAB_00246113:
    iVar8 = 0;
  }
  if ((char)uStack_b0 == '\x01') {
    uStack_b0 = uStack_b0 & 0xffffffffffffff00;
    QTemporaryDir::~QTemporaryDir(&local_b8._M_value);
  }
  if (local_f8 != (QArrayData *)0x0) {
    LOCK();
    (local_f8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_f8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_f8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_f8,1,0x10);
    }
  }
  if (pQVar15 != (QArrayData *)0x0) {
    LOCK();
    (pQVar15->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar15->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar15->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar15,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar8;
  }
LAB_00246421:
  __stack_chk_fail();
}

Assistant:

bool QLocalServerPrivate::listen(const QString &requestedServerName)
{
    Q_Q(QLocalServer);

    // socket options adjusted for current platform
    auto options = optionsForPlatform(socketOptions.value());

    // determine the full server path
    if (options.testFlag(QLocalServer::AbstractNamespaceOption)
        ||  requestedServerName.startsWith(u'/')) {
        fullServerName = requestedServerName;
    } else {
        fullServerName = QDir::cleanPath(QDir::tempPath());
        fullServerName += u'/' + requestedServerName;
    }
    serverName = requestedServerName;

    QByteArray encodedTempPath;
    const QByteArray encodedFullServerName = QFile::encodeName(fullServerName);
    std::optional<QTemporaryDir> tempDir;

    if (options & QLocalServer::WorldAccessOption) {
        QFileInfo serverNameFileInfo(fullServerName);
        tempDir.emplace(serverNameFileInfo.absolutePath() + u'/');
        if (!tempDir->isValid()) {
            setError("QLocalServer::listen"_L1);
            return false;
        }
        encodedTempPath = QFile::encodeName(tempDir->path() + "/s"_L1);
    }

    // create the unix socket
    listenSocket = qt_safe_socket(PF_UNIX, SOCK_STREAM, 0);
    if (-1 == listenSocket) {
        setError("QLocalServer::listen"_L1);
        closeServer();
        return false;
    }

    // Construct the unix address
    struct ::sockaddr_un addr;

    addr.sun_family = PF_UNIX;
    ::memset(addr.sun_path, 0, sizeof(addr.sun_path));

    // for abstract namespace add 2 to length, to take into account trailing AND leading null
    constexpr unsigned int extraCharacters = PlatformSupportsAbstractNamespace ? 2 : 1;

    if (sizeof(addr.sun_path) < static_cast<size_t>(encodedFullServerName.size() + extraCharacters)) {
        setError("QLocalServer::listen"_L1);
        closeServer();
        return false;
    }

    QT_SOCKLEN_T addrSize = sizeof(::sockaddr_un);
    if (options.testFlag(QLocalServer::AbstractNamespaceOption)) {
        // Abstract socket address is distinguished by the fact
        // that sun_path[0] is a null byte ('\0')
        ::memcpy(addr.sun_path + 1, encodedFullServerName.constData(),
                 encodedFullServerName.size() + 1);
        addrSize = offsetof(::sockaddr_un, sun_path) + encodedFullServerName.size() + 1;
    } else if (options & QLocalServer::WorldAccessOption) {
        if (sizeof(addr.sun_path) < static_cast<size_t>(encodedTempPath.size() + 1)) {
            setError("QLocalServer::listen"_L1);
            closeServer();
            return false;
        }
        ::memcpy(addr.sun_path, encodedTempPath.constData(),
                 encodedTempPath.size() + 1);
    } else {
        ::memcpy(addr.sun_path, encodedFullServerName.constData(),
                 encodedFullServerName.size() + 1);
    }

    // bind
    if (-1 == QT_SOCKET_BIND(listenSocket, (sockaddr *)&addr, addrSize)) {
        setError("QLocalServer::listen"_L1);
        // if address is in use already, just close the socket, but do not delete the file
        if (errno == EADDRINUSE)
            QT_CLOSE(listenSocket);
        // otherwise, close the socket and delete the file
        else
            closeServer();
        listenSocket = -1;
        return false;
    }

    // listen for connections
    if (-1 == qt_safe_listen(listenSocket, listenBacklog)) {
        setError("QLocalServer::listen"_L1);
        closeServer();
        return false;
    }

    if (options & QLocalServer::WorldAccessOption) {
        mode_t mode = 000;

        if (options & QLocalServer::UserAccessOption)
            mode |= S_IRWXU;

        if (options & QLocalServer::GroupAccessOption)
            mode |= S_IRWXG;

        if (options & QLocalServer::OtherAccessOption)
            mode |= S_IRWXO;

        if (::chmod(encodedTempPath.constData(), mode) == -1) {
            setError("QLocalServer::listen"_L1);
            closeServer();
            return false;
        }

        if (::rename(encodedTempPath.constData(), encodedFullServerName.constData()) == -1) {
            setError("QLocalServer::listen"_L1);
            closeServer();
            return false;
        }
    }

    Q_ASSERT(!socketNotifier);
    socketNotifier = new QSocketNotifier(listenSocket,
                                         QSocketNotifier::Read, q);
    q->connect(socketNotifier, SIGNAL(activated(QSocketDescriptor)),
               q, SLOT(_q_onNewConnection()));
    socketNotifier->setEnabled(maxPendingConnections > 0);
    return true;
}